

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [32];
  byte bVar7;
  undefined1 auVar8 [32];
  long lVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int iVar14;
  AABBNodeMB4D *node1;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [64];
  float fVar84;
  float fVar86;
  float fVar87;
  undefined1 auVar85 [16];
  float fVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar102 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar110 [16];
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar131 [64];
  undefined1 auVar135 [16];
  undefined1 auVar136 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_16f1;
  ulong *local_16f0;
  ulong *local_16e8;
  undefined8 local_16e0;
  float fStack_16d8;
  float fStack_16d4;
  undefined1 local_16d0 [16];
  undefined1 local_16c0 [16];
  undefined1 local_16b0 [16];
  size_t local_16a0;
  RayK<8> *local_1698;
  undefined1 local_1690 [16];
  undefined1 local_1680 [16];
  undefined1 local_1670 [16];
  undefined1 local_1660 [16];
  undefined1 local_1650 [16];
  undefined1 local_1640 [16];
  undefined1 local_1630 [16];
  ulong local_1618;
  long local_1610;
  long local_1608;
  Scene *local_1600;
  ulong local_15f8;
  RTCFilterFunctionNArguments local_15f0;
  undefined1 local_15c0 [32];
  undefined1 local_1590 [16];
  undefined1 local_1580 [16];
  undefined8 local_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  float local_1550;
  float fStack_154c;
  float fStack_1548;
  float fStack_1544;
  undefined1 local_1540 [16];
  undefined1 local_1530 [16];
  undefined1 *local_1520;
  undefined1 local_1510 [16];
  undefined1 local_1500 [16];
  undefined1 local_14f0 [16];
  undefined1 local_14e0 [16];
  undefined1 local_14d0 [16];
  undefined1 local_14c0 [16];
  undefined1 local_14b0 [16];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  float local_1440;
  float fStack_143c;
  float fStack_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  float fStack_1424;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float fStack_13e4;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  RTCHitN local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined4 local_12c0;
  undefined4 uStack_12bc;
  undefined4 uStack_12b8;
  undefined4 uStack_12b4;
  undefined4 uStack_12b0;
  undefined4 uStack_12ac;
  undefined4 uStack_12a8;
  undefined4 uStack_12a4;
  undefined4 local_12a0;
  undefined4 uStack_129c;
  undefined4 uStack_1298;
  undefined4 uStack_1294;
  undefined4 uStack_1290;
  undefined4 uStack_128c;
  undefined4 uStack_1288;
  undefined4 uStack_1284;
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  uint local_1240;
  uint uStack_123c;
  uint uStack_1238;
  uint uStack_1234;
  uint uStack_1230;
  uint uStack_122c;
  uint uStack_1228;
  uint uStack_1224;
  uint local_1220;
  uint uStack_121c;
  uint uStack_1218;
  uint uStack_1214;
  uint uStack_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_16e8 = local_11f8;
  local_1200 = root.ptr;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1340._4_4_ = uVar2;
  local_1340._0_4_ = uVar2;
  local_1340._8_4_ = uVar2;
  local_1340._12_4_ = uVar2;
  local_1340._16_4_ = uVar2;
  local_1340._20_4_ = uVar2;
  local_1340._24_4_ = uVar2;
  local_1340._28_4_ = uVar2;
  auVar71 = ZEXT3264(local_1340);
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1360._4_4_ = uVar2;
  local_1360._0_4_ = uVar2;
  local_1360._8_4_ = uVar2;
  local_1360._12_4_ = uVar2;
  local_1360._16_4_ = uVar2;
  local_1360._20_4_ = uVar2;
  local_1360._24_4_ = uVar2;
  local_1360._28_4_ = uVar2;
  auVar78 = ZEXT3264(local_1360);
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1380._4_4_ = uVar2;
  local_1380._0_4_ = uVar2;
  local_1380._8_4_ = uVar2;
  local_1380._12_4_ = uVar2;
  local_1380._16_4_ = uVar2;
  local_1380._20_4_ = uVar2;
  local_1380._24_4_ = uVar2;
  local_1380._28_4_ = uVar2;
  auVar83 = ZEXT3264(local_1380);
  fVar101 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar109 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar117 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar84 = fVar101 * 0.99999964;
  fVar88 = fVar109 * 0.99999964;
  fVar94 = fVar117 * 0.99999964;
  fVar101 = fVar101 * 1.0000004;
  fVar109 = fVar109 * 1.0000004;
  fVar117 = fVar117 * 1.0000004;
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_15f8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar32 = uVar24 ^ 0x20;
  uVar30 = local_15f8 ^ 0x20;
  iVar14 = (tray->tnear).field_0.i[k];
  local_1460._4_4_ = iVar14;
  local_1460._0_4_ = iVar14;
  local_1460._8_4_ = iVar14;
  local_1460._12_4_ = iVar14;
  local_1460._16_4_ = iVar14;
  local_1460._20_4_ = iVar14;
  local_1460._24_4_ = iVar14;
  local_1460._28_4_ = iVar14;
  auVar131 = ZEXT3264(local_1460);
  iVar14 = (tray->tfar).field_0.i[k];
  local_1480._4_4_ = iVar14;
  local_1480._0_4_ = iVar14;
  local_1480._8_4_ = iVar14;
  local_1480._12_4_ = iVar14;
  local_1480._16_4_ = iVar14;
  local_1480._20_4_ = iVar14;
  local_1480._24_4_ = iVar14;
  local_1480._28_4_ = iVar14;
  auVar136 = ZEXT3264(local_1480);
  iVar14 = 1 << ((uint)k & 0x1f);
  auVar39._4_4_ = iVar14;
  auVar39._0_4_ = iVar14;
  auVar39._8_4_ = iVar14;
  auVar39._12_4_ = iVar14;
  auVar39._16_4_ = iVar14;
  auVar39._20_4_ = iVar14;
  auVar39._24_4_ = iVar14;
  auVar39._28_4_ = iVar14;
  auVar8 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar39 = vpand_avx2(auVar39,auVar8);
  local_14a0 = vpcmpeqd_avx2(auVar39,auVar8);
  local_13a0 = fVar84;
  fStack_139c = fVar84;
  fStack_1398 = fVar84;
  fStack_1394 = fVar84;
  fStack_1390 = fVar84;
  fStack_138c = fVar84;
  fStack_1388 = fVar84;
  fStack_1384 = fVar84;
  local_13c0 = fVar88;
  fStack_13bc = fVar88;
  fStack_13b8 = fVar88;
  fStack_13b4 = fVar88;
  fStack_13b0 = fVar88;
  fStack_13ac = fVar88;
  fStack_13a8 = fVar88;
  fStack_13a4 = fVar88;
  local_13e0 = fVar94;
  fStack_13dc = fVar94;
  fStack_13d8 = fVar94;
  fStack_13d4 = fVar94;
  fStack_13d0 = fVar94;
  fStack_13cc = fVar94;
  fStack_13c8 = fVar94;
  fStack_13c4 = fVar94;
  local_1400 = fVar101;
  fStack_13fc = fVar101;
  fStack_13f8 = fVar101;
  fStack_13f4 = fVar101;
  fStack_13f0 = fVar101;
  fStack_13ec = fVar101;
  fStack_13e8 = fVar101;
  fStack_13e4 = fVar101;
  local_1420 = fVar109;
  fStack_141c = fVar109;
  fStack_1418 = fVar109;
  fStack_1414 = fVar109;
  fStack_1410 = fVar109;
  fStack_140c = fVar109;
  fStack_1408 = fVar109;
  fStack_1404 = fVar109;
  local_1440 = fVar117;
  fStack_143c = fVar117;
  fStack_1438 = fVar117;
  fStack_1434 = fVar117;
  fStack_1430 = fVar117;
  fStack_142c = fVar117;
  fStack_1428 = fVar117;
  fStack_1424 = fVar117;
  fVar86 = fVar84;
  fVar87 = fVar84;
  fVar118 = fVar84;
  fVar122 = fVar84;
  fVar124 = fVar84;
  fVar126 = fVar84;
  fVar130 = fVar88;
  fVar132 = fVar88;
  fVar133 = fVar88;
  fVar134 = fVar88;
  fVar92 = fVar88;
  fVar93 = fVar88;
  fVar95 = fVar94;
  fVar96 = fVar94;
  fVar97 = fVar94;
  fVar98 = fVar94;
  fVar99 = fVar94;
  fVar100 = fVar94;
  fVar103 = fVar101;
  fVar104 = fVar101;
  fVar105 = fVar101;
  fVar106 = fVar101;
  fVar107 = fVar101;
  fVar108 = fVar101;
  fVar111 = fVar109;
  fVar112 = fVar109;
  fVar113 = fVar109;
  fVar114 = fVar109;
  fVar115 = fVar109;
  fVar116 = fVar109;
  fVar121 = fVar117;
  fVar123 = fVar117;
  fVar125 = fVar117;
  fVar127 = fVar117;
  fVar128 = fVar117;
  fVar129 = fVar117;
  local_16a0 = k;
  local_1698 = ray;
  local_1618 = uVar24;
  do {
    if (local_16e8 == &local_1200) {
LAB_016d1fd7:
      return local_16e8 != &local_1200;
    }
    local_16f0 = local_16e8 + -1;
    uVar31 = local_16e8[-1];
    while ((uVar31 & 8) == 0) {
      uVar2 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar40._4_4_ = uVar2;
      auVar40._0_4_ = uVar2;
      auVar40._8_4_ = uVar2;
      auVar40._12_4_ = uVar2;
      auVar40._16_4_ = uVar2;
      auVar40._20_4_ = uVar2;
      auVar40._24_4_ = uVar2;
      auVar40._28_4_ = uVar2;
      uVar15 = uVar31 & 0xfffffffffffffff0;
      auVar66 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar24),auVar40,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + uVar24));
      auVar39 = vsubps_avx(ZEXT1632(auVar66),auVar71._0_32_);
      auVar8._4_4_ = fVar86 * auVar39._4_4_;
      auVar8._0_4_ = fVar84 * auVar39._0_4_;
      auVar8._8_4_ = fVar87 * auVar39._8_4_;
      auVar8._12_4_ = fVar118 * auVar39._12_4_;
      auVar8._16_4_ = fVar122 * auVar39._16_4_;
      auVar8._20_4_ = fVar124 * auVar39._20_4_;
      auVar8._24_4_ = fVar126 * auVar39._24_4_;
      auVar8._28_4_ = auVar39._28_4_;
      auVar39 = vmaxps_avx(auVar131._0_32_,auVar8);
      auVar66 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + local_15f8),auVar40,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + local_15f8));
      auVar8 = vsubps_avx(ZEXT1632(auVar66),auVar78._0_32_);
      auVar6._4_4_ = fVar130 * auVar8._4_4_;
      auVar6._0_4_ = fVar88 * auVar8._0_4_;
      auVar6._8_4_ = fVar132 * auVar8._8_4_;
      auVar6._12_4_ = fVar133 * auVar8._12_4_;
      auVar6._16_4_ = fVar134 * auVar8._16_4_;
      auVar6._20_4_ = fVar92 * auVar8._20_4_;
      auVar6._24_4_ = fVar93 * auVar8._24_4_;
      auVar6._28_4_ = auVar8._28_4_;
      auVar66 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar19),auVar40,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + uVar19));
      auVar8 = vsubps_avx(ZEXT1632(auVar66),auVar83._0_32_);
      auVar10._4_4_ = fVar95 * auVar8._4_4_;
      auVar10._0_4_ = fVar94 * auVar8._0_4_;
      auVar10._8_4_ = fVar96 * auVar8._8_4_;
      auVar10._12_4_ = fVar97 * auVar8._12_4_;
      auVar10._16_4_ = fVar98 * auVar8._16_4_;
      auVar10._20_4_ = fVar99 * auVar8._20_4_;
      auVar10._24_4_ = fVar100 * auVar8._24_4_;
      auVar10._28_4_ = auVar8._28_4_;
      auVar8 = vmaxps_avx(auVar6,auVar10);
      auVar39 = vmaxps_avx(auVar39,auVar8);
      auVar66 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar32),auVar40,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + uVar32));
      auVar8 = vsubps_avx(ZEXT1632(auVar66),auVar71._0_32_);
      auVar11._4_4_ = fVar103 * auVar8._4_4_;
      auVar11._0_4_ = fVar101 * auVar8._0_4_;
      auVar11._8_4_ = fVar104 * auVar8._8_4_;
      auVar11._12_4_ = fVar105 * auVar8._12_4_;
      auVar11._16_4_ = fVar106 * auVar8._16_4_;
      auVar11._20_4_ = fVar107 * auVar8._20_4_;
      auVar11._24_4_ = fVar108 * auVar8._24_4_;
      auVar11._28_4_ = auVar8._28_4_;
      auVar8 = vminps_avx(auVar136._0_32_,auVar11);
      auVar66 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar30),auVar40,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + uVar30));
      auVar6 = vsubps_avx(ZEXT1632(auVar66),auVar78._0_32_);
      auVar66 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + (uVar19 ^ 0x20)),auVar40,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + (uVar19 ^ 0x20)));
      auVar12._4_4_ = fVar111 * auVar6._4_4_;
      auVar12._0_4_ = fVar109 * auVar6._0_4_;
      auVar12._8_4_ = fVar112 * auVar6._8_4_;
      auVar12._12_4_ = fVar113 * auVar6._12_4_;
      auVar12._16_4_ = fVar114 * auVar6._16_4_;
      auVar12._20_4_ = fVar115 * auVar6._20_4_;
      auVar12._24_4_ = fVar116 * auVar6._24_4_;
      auVar12._28_4_ = auVar6._28_4_;
      auVar6 = vsubps_avx(ZEXT1632(auVar66),auVar83._0_32_);
      auVar13._4_4_ = fVar121 * auVar6._4_4_;
      auVar13._0_4_ = fVar117 * auVar6._0_4_;
      auVar13._8_4_ = fVar123 * auVar6._8_4_;
      auVar13._12_4_ = fVar125 * auVar6._12_4_;
      auVar13._16_4_ = fVar127 * auVar6._16_4_;
      auVar13._20_4_ = fVar128 * auVar6._20_4_;
      auVar13._24_4_ = fVar129 * auVar6._24_4_;
      auVar13._28_4_ = auVar6._28_4_;
      auVar6 = vminps_avx(auVar12,auVar13);
      auVar8 = vminps_avx(auVar8,auVar6);
      auVar39 = vcmpps_avx(auVar39,auVar8,2);
      if (((uint)uVar31 & 7) == 6) {
        auVar8 = vcmpps_avx(*(undefined1 (*) [32])(uVar15 + 0x1c0),auVar40,2);
        auVar6 = vcmpps_avx(auVar40,*(undefined1 (*) [32])(uVar15 + 0x1e0),1);
        auVar8 = vandps_avx(auVar8,auVar6);
        auVar39 = vandps_avx(auVar8,auVar39);
        auVar66 = vpackssdw_avx(auVar39._0_16_,auVar39._16_16_);
      }
      else {
        auVar66 = vpackssdw_avx(auVar39._0_16_,auVar39._16_16_);
      }
      auVar33 = vpsllw_avx(auVar66,0xf);
      auVar66 = vpacksswb_avx(auVar33,auVar33);
      bVar7 = SUB161(auVar66 >> 7,0) & 1 | (SUB161(auVar66 >> 0xf,0) & 1) << 1 |
              (SUB161(auVar66 >> 0x17,0) & 1) << 2 | (SUB161(auVar66 >> 0x1f,0) & 1) << 3 |
              (SUB161(auVar66 >> 0x27,0) & 1) << 4 | (SUB161(auVar66 >> 0x2f,0) & 1) << 5 |
              (SUB161(auVar66 >> 0x37,0) & 1) << 6 | SUB161(auVar66 >> 0x3f,0) << 7;
      if ((((((((auVar33 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar33 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar33 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar33 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar33 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar33 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar33 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar33[0xf])
      goto LAB_016d1fac;
      lVar9 = 0;
      for (uVar31 = (ulong)bVar7; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
        lVar9 = lVar9 + 1;
      }
      uVar31 = *(ulong *)(uVar15 + lVar9 * 8);
      uVar16 = bVar7 - 1 & (uint)bVar7;
      uVar17 = (ulong)uVar16;
      if (uVar16 != 0) {
        do {
          *local_16f0 = uVar31;
          local_16f0 = local_16f0 + 1;
          lVar9 = 0;
          for (uVar31 = uVar17; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
            lVar9 = lVar9 + 1;
          }
          uVar17 = uVar17 - 1 & uVar17;
          uVar31 = *(ulong *)(uVar15 + lVar9 * 8);
        } while (uVar17 != 0);
      }
    }
    local_1608 = (ulong)((uint)uVar31 & 0xf) - 8;
    uVar31 = uVar31 & 0xfffffffffffffff0;
    for (local_1610 = 0; local_1610 != local_1608; local_1610 = local_1610 + 1) {
      lVar21 = local_1610 * 0x50;
      local_1600 = context->scene;
      pGVar4 = (local_1600->geometries).items[*(uint *)(uVar31 + 0x30 + lVar21)].ptr;
      fVar101 = (pGVar4->time_range).lower;
      fVar101 = pGVar4->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar101) / ((pGVar4->time_range).upper - fVar101)
                );
      auVar66 = vroundss_avx(ZEXT416((uint)fVar101),ZEXT416((uint)fVar101),9);
      auVar66 = vminss_avx(auVar66,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
      auVar42 = vmaxss_avx(ZEXT816(0),auVar66);
      lVar18 = (long)(int)auVar42._0_4_ * 0x38;
      uVar22 = (ulong)*(uint *)(uVar31 + 4 + lVar21);
      lVar9 = *(long *)(*(long *)&pGVar4[2].numPrimitives + lVar18);
      lVar18 = *(long *)(*(long *)&pGVar4[2].numPrimitives + 0x38 + lVar18);
      auVar66 = *(undefined1 (*) [16])(lVar9 + (ulong)*(uint *)(uVar31 + lVar21) * 4);
      uVar17 = (ulong)*(uint *)(uVar31 + 0x10 + lVar21);
      auVar33 = *(undefined1 (*) [16])(lVar9 + uVar17 * 4);
      uVar25 = (ulong)*(uint *)(uVar31 + 0x20 + lVar21);
      auVar55 = *(undefined1 (*) [16])(lVar9 + uVar25 * 4);
      auVar41 = *(undefined1 (*) [16])(lVar9 + uVar22 * 4);
      uVar26 = (ulong)*(uint *)(uVar31 + 0x14 + lVar21);
      auVar48 = *(undefined1 (*) [16])(lVar9 + uVar26 * 4);
      uVar27 = (ulong)*(uint *)(uVar31 + 0x24 + lVar21);
      auVar54 = *(undefined1 (*) [16])(lVar9 + uVar27 * 4);
      uVar20 = (ulong)*(uint *)(uVar31 + 8 + lVar21);
      auVar57 = *(undefined1 (*) [16])(lVar9 + uVar20 * 4);
      uVar24 = (ulong)*(uint *)(uVar31 + 0x18 + lVar21);
      auVar58 = *(undefined1 (*) [16])(lVar9 + uVar24 * 4);
      uVar28 = (ulong)*(uint *)(uVar31 + 0x28 + lVar21);
      auVar44 = *(undefined1 (*) [16])(lVar9 + uVar28 * 4);
      uVar23 = (ulong)*(uint *)(uVar31 + 0xc + lVar21);
      auVar51 = *(undefined1 (*) [16])(lVar9 + uVar23 * 4);
      uVar29 = (ulong)*(uint *)(uVar31 + 0x1c + lVar21);
      auVar46 = *(undefined1 (*) [16])(lVar9 + uVar29 * 4);
      uVar15 = (ulong)*(uint *)(uVar31 + 0x2c + lVar21);
      auVar34 = *(undefined1 (*) [16])(lVar9 + uVar15 * 4);
      auVar35 = *(undefined1 (*) [16])(lVar18 + (ulong)*(uint *)(uVar31 + lVar21) * 4);
      auVar36 = *(undefined1 (*) [16])(lVar18 + uVar17 * 4);
      fVar101 = fVar101 - auVar42._0_4_;
      auVar42 = vunpcklps_avx(auVar66,auVar57);
      auVar57 = vunpckhps_avx(auVar66,auVar57);
      auVar43 = vunpcklps_avx(auVar41,auVar51);
      auVar41 = vunpckhps_avx(auVar41,auVar51);
      auVar66 = *(undefined1 (*) [16])(lVar18 + uVar22 * 4);
      auVar47 = vunpcklps_avx(auVar57,auVar41);
      auVar49 = vunpcklps_avx(auVar42,auVar43);
      auVar57 = vunpckhps_avx(auVar42,auVar43);
      auVar51 = vunpcklps_avx(auVar33,auVar58);
      auVar41 = vunpckhps_avx(auVar33,auVar58);
      auVar58 = vunpcklps_avx(auVar48,auVar46);
      auVar48 = vunpckhps_avx(auVar48,auVar46);
      auVar33 = *(undefined1 (*) [16])(lVar18 + uVar20 * 4);
      auVar46 = vunpcklps_avx(auVar41,auVar48);
      auVar42 = vunpcklps_avx(auVar51,auVar58);
      auVar48 = vunpckhps_avx(auVar51,auVar58);
      auVar51 = vunpcklps_avx(auVar55,auVar44);
      auVar58 = vunpckhps_avx(auVar55,auVar44);
      auVar43 = vunpcklps_avx(auVar54,auVar34);
      auVar44 = vunpckhps_avx(auVar54,auVar34);
      auVar41 = *(undefined1 (*) [16])(lVar18 + uVar23 * 4);
      auVar34 = vunpcklps_avx(auVar58,auVar44);
      auVar55 = vunpcklps_avx(auVar51,auVar43);
      auVar58 = vunpckhps_avx(auVar51,auVar43);
      auVar44 = vunpcklps_avx(auVar35,auVar33);
      auVar33 = vunpckhps_avx(auVar35,auVar33);
      auVar51 = vunpcklps_avx(auVar66,auVar41);
      auVar41 = vunpckhps_avx(auVar66,auVar41);
      auVar66 = *(undefined1 (*) [16])(lVar18 + uVar24 * 4);
      auVar35 = vunpcklps_avx(auVar33,auVar41);
      auVar43 = vunpcklps_avx(auVar44,auVar51);
      auVar41 = vunpckhps_avx(auVar44,auVar51);
      auVar51 = vunpcklps_avx(auVar36,auVar66);
      auVar44 = vunpckhps_avx(auVar36,auVar66);
      auVar66 = *(undefined1 (*) [16])(lVar18 + uVar26 * 4);
      auVar33 = *(undefined1 (*) [16])(lVar18 + uVar29 * 4);
      auVar36 = vunpcklps_avx(auVar66,auVar33);
      auVar66 = vunpckhps_avx(auVar66,auVar33);
      auVar54 = vunpcklps_avx(auVar44,auVar66);
      auVar56 = vunpcklps_avx(auVar51,auVar36);
      auVar44 = vunpckhps_avx(auVar51,auVar36);
      auVar66 = *(undefined1 (*) [16])(lVar18 + uVar25 * 4);
      auVar33 = *(undefined1 (*) [16])(lVar18 + uVar28 * 4);
      auVar36 = vunpcklps_avx(auVar66,auVar33);
      auVar51 = vunpckhps_avx(auVar66,auVar33);
      auVar66 = *(undefined1 (*) [16])(lVar18 + uVar27 * 4);
      auVar33 = *(undefined1 (*) [16])(lVar18 + uVar15 * 4);
      auVar59 = vunpcklps_avx(auVar66,auVar33);
      auVar66 = vunpckhps_avx(auVar66,auVar33);
      auVar33 = vunpcklps_avx(auVar51,auVar66);
      auVar51 = vunpcklps_avx(auVar36,auVar59);
      auVar66 = vunpckhps_avx(auVar36,auVar59);
      fVar109 = 1.0 - fVar101;
      auVar110._4_4_ = fVar109;
      auVar110._0_4_ = fVar109;
      auVar110._8_4_ = fVar109;
      auVar110._12_4_ = fVar109;
      auVar85._0_4_ = fVar101 * auVar43._0_4_;
      auVar85._4_4_ = fVar101 * auVar43._4_4_;
      auVar85._8_4_ = fVar101 * auVar43._8_4_;
      auVar85._12_4_ = fVar101 * auVar43._12_4_;
      auVar36 = vfmadd231ps_fma(auVar85,auVar110,auVar49);
      auVar72._0_4_ = fVar101 * auVar41._0_4_;
      auVar72._4_4_ = fVar101 * auVar41._4_4_;
      auVar72._8_4_ = fVar101 * auVar41._8_4_;
      auVar72._12_4_ = fVar101 * auVar41._12_4_;
      auVar57 = vfmadd231ps_fma(auVar72,auVar110,auVar57);
      auVar79._0_4_ = fVar101 * auVar35._0_4_;
      auVar79._4_4_ = fVar101 * auVar35._4_4_;
      auVar79._8_4_ = fVar101 * auVar35._8_4_;
      auVar79._12_4_ = fVar101 * auVar35._12_4_;
      auVar35 = vfmadd231ps_fma(auVar79,auVar110,auVar47);
      auVar89._0_4_ = fVar101 * auVar56._0_4_;
      auVar89._4_4_ = fVar101 * auVar56._4_4_;
      auVar89._8_4_ = fVar101 * auVar56._8_4_;
      auVar89._12_4_ = fVar101 * auVar56._12_4_;
      auVar42 = vfmadd231ps_fma(auVar89,auVar110,auVar42);
      auVar59._0_4_ = fVar101 * auVar44._0_4_;
      auVar59._4_4_ = fVar101 * auVar44._4_4_;
      auVar59._8_4_ = fVar101 * auVar44._8_4_;
      auVar59._12_4_ = fVar101 * auVar44._12_4_;
      auVar48 = vfmadd231ps_fma(auVar59,auVar110,auVar48);
      puVar1 = (undefined8 *)(uVar31 + 0x30 + lVar21);
      local_1560 = *puVar1;
      uStack_1558 = puVar1[1];
      puVar1 = (undefined8 *)(uVar31 + 0x40 + lVar21);
      auVar41._0_4_ = fVar101 * auVar54._0_4_;
      auVar41._4_4_ = fVar101 * auVar54._4_4_;
      auVar41._8_4_ = fVar101 * auVar54._8_4_;
      auVar41._12_4_ = fVar101 * auVar54._12_4_;
      auVar44 = vfmadd231ps_fma(auVar41,auVar110,auVar46);
      auVar46._0_4_ = fVar101 * auVar51._0_4_;
      auVar46._4_4_ = fVar101 * auVar51._4_4_;
      auVar46._8_4_ = fVar101 * auVar51._8_4_;
      auVar46._12_4_ = fVar101 * auVar51._12_4_;
      auVar54._0_4_ = fVar101 * auVar66._0_4_;
      auVar54._4_4_ = fVar101 * auVar66._4_4_;
      auVar54._8_4_ = fVar101 * auVar66._8_4_;
      auVar54._12_4_ = fVar101 * auVar66._12_4_;
      auVar66._0_4_ = fVar101 * auVar33._0_4_;
      auVar66._4_4_ = fVar101 * auVar33._4_4_;
      auVar66._8_4_ = fVar101 * auVar33._8_4_;
      auVar66._12_4_ = fVar101 * auVar33._12_4_;
      auVar51 = vfmadd231ps_fma(auVar46,auVar110,auVar55);
      auVar58 = vfmadd231ps_fma(auVar54,auVar110,auVar58);
      auVar46 = vfmadd231ps_fma(auVar66,auVar110,auVar34);
      local_1570 = *puVar1;
      uStack_1568 = puVar1[1];
      uVar2 = *(undefined4 *)(local_1698 + local_16a0 * 4);
      auVar34._4_4_ = uVar2;
      auVar34._0_4_ = uVar2;
      auVar34._8_4_ = uVar2;
      auVar34._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(local_1698 + local_16a0 * 4 + 0x20);
      auVar102._4_4_ = uVar2;
      auVar102._0_4_ = uVar2;
      auVar102._8_4_ = uVar2;
      auVar102._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(local_1698 + local_16a0 * 4 + 0x40);
      auVar119._4_4_ = uVar2;
      auVar119._0_4_ = uVar2;
      auVar119._8_4_ = uVar2;
      auVar119._12_4_ = uVar2;
      auVar41 = vsubps_avx(auVar36,auVar34);
      local_16c0 = vsubps_avx(auVar57,auVar102);
      local_1660 = vsubps_avx(auVar35,auVar119);
      auVar66 = vsubps_avx(auVar42,auVar34);
      auVar33 = vsubps_avx(auVar48,auVar102);
      auVar48 = vsubps_avx(auVar44,auVar119);
      auVar57 = vsubps_avx(auVar51,auVar34);
      auVar58 = vsubps_avx(auVar58,auVar102);
      auVar44 = vsubps_avx(auVar46,auVar119);
      local_1670 = vsubps_avx(auVar57,auVar41);
      auVar51 = vsubps_avx(auVar58,local_16c0);
      local_1680 = vsubps_avx(auVar44,local_1660);
      auVar35._0_4_ = auVar41._0_4_ + auVar57._0_4_;
      auVar35._4_4_ = auVar41._4_4_ + auVar57._4_4_;
      auVar35._8_4_ = auVar41._8_4_ + auVar57._8_4_;
      auVar35._12_4_ = auVar41._12_4_ + auVar57._12_4_;
      auVar55._0_4_ = auVar58._0_4_ + local_16c0._0_4_;
      auVar55._4_4_ = auVar58._4_4_ + local_16c0._4_4_;
      auVar55._8_4_ = auVar58._8_4_ + local_16c0._8_4_;
      auVar55._12_4_ = auVar58._12_4_ + local_16c0._12_4_;
      fVar101 = local_1660._0_4_;
      auVar60._0_4_ = auVar44._0_4_ + fVar101;
      fVar109 = local_1660._4_4_;
      auVar60._4_4_ = auVar44._4_4_ + fVar109;
      fVar117 = local_1660._8_4_;
      auVar60._8_4_ = auVar44._8_4_ + fVar117;
      fVar84 = local_1660._12_4_;
      auVar60._12_4_ = auVar44._12_4_ + fVar84;
      auVar120._0_4_ = local_1680._0_4_ * auVar55._0_4_;
      auVar120._4_4_ = local_1680._4_4_ * auVar55._4_4_;
      auVar120._8_4_ = local_1680._8_4_ * auVar55._8_4_;
      auVar120._12_4_ = local_1680._12_4_ * auVar55._12_4_;
      auVar34 = vfmsub231ps_fma(auVar120,auVar51,auVar60);
      auVar61._0_4_ = local_1670._0_4_ * auVar60._0_4_;
      auVar61._4_4_ = local_1670._4_4_ * auVar60._4_4_;
      auVar61._8_4_ = local_1670._8_4_ * auVar60._8_4_;
      auVar61._12_4_ = local_1670._12_4_ * auVar60._12_4_;
      auVar46 = vfmsub231ps_fma(auVar61,local_1680,auVar35);
      auVar36._0_4_ = auVar51._0_4_ * auVar35._0_4_;
      auVar36._4_4_ = auVar51._4_4_ * auVar35._4_4_;
      auVar36._8_4_ = auVar51._8_4_ * auVar35._8_4_;
      auVar36._12_4_ = auVar51._12_4_ * auVar35._12_4_;
      auVar35 = vfmsub231ps_fma(auVar36,local_1670,auVar55);
      local_16e0._4_4_ = *(float *)(local_1698 + local_16a0 * 4 + 0xc0);
      auVar56._0_4_ = local_16e0._4_4_ * auVar35._0_4_;
      auVar56._4_4_ = local_16e0._4_4_ * auVar35._4_4_;
      auVar56._8_4_ = local_16e0._4_4_ * auVar35._8_4_;
      auVar56._12_4_ = local_16e0._4_4_ * auVar35._12_4_;
      uVar2 = *(undefined4 *)(local_1698 + local_16a0 * 4 + 0xa0);
      auVar135._4_4_ = uVar2;
      auVar135._0_4_ = uVar2;
      auVar135._8_4_ = uVar2;
      auVar135._12_4_ = uVar2;
      auVar46 = vfmadd231ps_fma(auVar56,auVar135,auVar46);
      uVar2 = *(undefined4 *)(local_1698 + local_16a0 * 4 + 0x80);
      local_16d0._4_4_ = uVar2;
      local_16d0._0_4_ = uVar2;
      local_16d0._8_4_ = uVar2;
      local_16d0._12_4_ = uVar2;
      local_1580 = vfmadd231ps_fma(auVar46,local_16d0,auVar34);
      local_1630 = vsubps_avx(local_16c0,auVar33);
      local_1640 = vsubps_avx(local_1660,auVar48);
      auVar42._0_4_ = local_16c0._0_4_ + auVar33._0_4_;
      auVar42._4_4_ = local_16c0._4_4_ + auVar33._4_4_;
      auVar42._8_4_ = local_16c0._8_4_ + auVar33._8_4_;
      auVar42._12_4_ = local_16c0._12_4_ + auVar33._12_4_;
      auVar62._0_4_ = auVar48._0_4_ + fVar101;
      auVar62._4_4_ = auVar48._4_4_ + fVar109;
      auVar62._8_4_ = auVar48._8_4_ + fVar117;
      auVar62._12_4_ = auVar48._12_4_ + fVar84;
      fVar88 = local_1640._0_4_;
      auVar73._0_4_ = auVar42._0_4_ * fVar88;
      fVar94 = local_1640._4_4_;
      auVar73._4_4_ = auVar42._4_4_ * fVar94;
      fVar86 = local_1640._8_4_;
      auVar73._8_4_ = auVar42._8_4_ * fVar86;
      fVar87 = local_1640._12_4_;
      auVar73._12_4_ = auVar42._12_4_ * fVar87;
      auVar34 = vfmsub231ps_fma(auVar73,local_1630,auVar62);
      local_1650 = vsubps_avx(auVar41,auVar66);
      fVar118 = local_1650._0_4_;
      auVar80._0_4_ = fVar118 * auVar62._0_4_;
      fVar122 = local_1650._4_4_;
      auVar80._4_4_ = fVar122 * auVar62._4_4_;
      fVar124 = local_1650._8_4_;
      auVar80._8_4_ = fVar124 * auVar62._8_4_;
      fVar126 = local_1650._12_4_;
      auVar80._12_4_ = fVar126 * auVar62._12_4_;
      auVar63._0_4_ = auVar41._0_4_ + auVar66._0_4_;
      auVar63._4_4_ = auVar41._4_4_ + auVar66._4_4_;
      auVar63._8_4_ = auVar41._8_4_ + auVar66._8_4_;
      auVar63._12_4_ = auVar41._12_4_ + auVar66._12_4_;
      auVar46 = vfmsub231ps_fma(auVar80,local_1640,auVar63);
      fVar130 = local_1630._0_4_;
      auVar64._0_4_ = fVar130 * auVar63._0_4_;
      fVar132 = local_1630._4_4_;
      auVar64._4_4_ = fVar132 * auVar63._4_4_;
      fVar133 = local_1630._8_4_;
      auVar64._8_4_ = fVar133 * auVar63._8_4_;
      fVar134 = local_1630._12_4_;
      auVar64._12_4_ = fVar134 * auVar63._12_4_;
      auVar35 = vfmsub231ps_fma(auVar64,local_1650,auVar42);
      auVar65._0_4_ = local_16e0._4_4_ * auVar35._0_4_;
      auVar65._4_4_ = local_16e0._4_4_ * auVar35._4_4_;
      auVar65._8_4_ = local_16e0._4_4_ * auVar35._8_4_;
      auVar65._12_4_ = local_16e0._4_4_ * auVar35._12_4_;
      auVar46 = vfmadd231ps_fma(auVar65,auVar135,auVar46);
      local_1540 = vfmadd231ps_fma(auVar46,local_16d0,auVar34);
      auVar46 = vsubps_avx(auVar66,auVar57);
      auVar47._0_4_ = auVar66._0_4_ + auVar57._0_4_;
      auVar47._4_4_ = auVar66._4_4_ + auVar57._4_4_;
      auVar47._8_4_ = auVar66._8_4_ + auVar57._8_4_;
      auVar47._12_4_ = auVar66._12_4_ + auVar57._12_4_;
      auVar57 = vsubps_avx(auVar33,auVar58);
      auVar43._0_4_ = auVar58._0_4_ + auVar33._0_4_;
      auVar43._4_4_ = auVar58._4_4_ + auVar33._4_4_;
      auVar43._8_4_ = auVar58._8_4_ + auVar33._8_4_;
      auVar43._12_4_ = auVar58._12_4_ + auVar33._12_4_;
      auVar58 = vsubps_avx(auVar48,auVar44);
      auVar67._0_4_ = auVar48._0_4_ + auVar44._0_4_;
      auVar67._4_4_ = auVar48._4_4_ + auVar44._4_4_;
      auVar67._8_4_ = auVar48._8_4_ + auVar44._8_4_;
      auVar67._12_4_ = auVar48._12_4_ + auVar44._12_4_;
      auVar33._0_4_ = auVar58._0_4_ * auVar43._0_4_;
      auVar33._4_4_ = auVar58._4_4_ * auVar43._4_4_;
      auVar33._8_4_ = auVar58._8_4_ * auVar43._8_4_;
      auVar33._12_4_ = auVar58._12_4_ * auVar43._12_4_;
      auVar33 = vfmsub231ps_fma(auVar33,auVar57,auVar67);
      auVar68._0_4_ = auVar67._0_4_ * auVar46._0_4_;
      auVar68._4_4_ = auVar67._4_4_ * auVar46._4_4_;
      auVar68._8_4_ = auVar67._8_4_ * auVar46._8_4_;
      auVar68._12_4_ = auVar67._12_4_ * auVar46._12_4_;
      auVar66 = vfmsub231ps_fma(auVar68,auVar58,auVar47);
      auVar48._0_4_ = auVar57._0_4_ * auVar47._0_4_;
      auVar48._4_4_ = auVar57._4_4_ * auVar47._4_4_;
      auVar48._8_4_ = auVar57._8_4_ * auVar47._8_4_;
      auVar48._12_4_ = auVar57._12_4_ * auVar47._12_4_;
      auVar48 = vfmsub231ps_fma(auVar48,auVar46,auVar43);
      local_16e0._0_4_ = local_16e0._4_4_;
      fStack_16d8 = local_16e0._4_4_;
      fStack_16d4 = local_16e0._4_4_;
      auVar49._0_4_ = local_16e0._4_4_ * auVar48._0_4_;
      auVar49._4_4_ = local_16e0._4_4_ * auVar48._4_4_;
      auVar49._8_4_ = local_16e0._4_4_ * auVar48._8_4_;
      auVar49._12_4_ = local_16e0._4_4_ * auVar48._12_4_;
      auVar66 = vfmadd231ps_fma(auVar49,auVar135,auVar66);
      auVar48 = vfmadd231ps_fma(auVar66,local_16d0,auVar33);
      local_1550 = local_1580._0_4_;
      fStack_154c = local_1580._4_4_;
      fStack_1548 = local_1580._8_4_;
      fStack_1544 = local_1580._12_4_;
      local_1530._0_4_ = auVar48._0_4_ + local_1550 + local_1540._0_4_;
      local_1530._4_4_ = auVar48._4_4_ + fStack_154c + local_1540._4_4_;
      local_1530._8_4_ = auVar48._8_4_ + fStack_1548 + local_1540._8_4_;
      local_1530._12_4_ = auVar48._12_4_ + fStack_1544 + local_1540._12_4_;
      auVar44._8_4_ = 0x7fffffff;
      auVar44._0_8_ = 0x7fffffff7fffffff;
      auVar44._12_4_ = 0x7fffffff;
      auVar66 = vminps_avx(local_1580,local_1540);
      auVar66 = vminps_avx(auVar66,auVar48);
      local_1590 = vandps_avx(local_1530,auVar44);
      auVar81._0_4_ = local_1590._0_4_ * 1.1920929e-07;
      auVar81._4_4_ = local_1590._4_4_ * 1.1920929e-07;
      auVar81._8_4_ = local_1590._8_4_ * 1.1920929e-07;
      auVar81._12_4_ = local_1590._12_4_ * 1.1920929e-07;
      uVar24 = CONCAT44(auVar81._4_4_,auVar81._0_4_);
      auVar74._0_8_ = uVar24 ^ 0x8000000080000000;
      auVar74._8_4_ = -auVar81._8_4_;
      auVar74._12_4_ = -auVar81._12_4_;
      auVar66 = vcmpps_avx(auVar66,auVar74,5);
      auVar33 = vmaxps_avx(local_1580,local_1540);
      auVar33 = vmaxps_avx(auVar33,auVar48);
      auVar33 = vcmpps_avx(auVar33,auVar81,2);
      local_1690 = vorps_avx(auVar66,auVar33);
      k = local_16a0;
      ray = local_1698;
      if ((((local_1690 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (local_1690 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (local_1690 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          local_1690[0xf] < '\0') {
        auVar50._0_4_ = fVar130 * local_1680._0_4_;
        auVar50._4_4_ = fVar132 * local_1680._4_4_;
        auVar50._8_4_ = fVar133 * local_1680._8_4_;
        auVar50._12_4_ = fVar134 * local_1680._12_4_;
        auVar69._0_4_ = auVar51._0_4_ * fVar118;
        auVar69._4_4_ = auVar51._4_4_ * fVar122;
        auVar69._8_4_ = auVar51._8_4_ * fVar124;
        auVar69._12_4_ = auVar51._12_4_ * fVar126;
        auVar48 = vfmsub213ps_fma(auVar51,local_1640,auVar50);
        auVar75._0_4_ = auVar57._0_4_ * fVar88;
        auVar75._4_4_ = auVar57._4_4_ * fVar94;
        auVar75._8_4_ = auVar57._8_4_ * fVar86;
        auVar75._12_4_ = auVar57._12_4_ * fVar87;
        auVar82._0_4_ = auVar58._0_4_ * fVar118;
        auVar82._4_4_ = auVar58._4_4_ * fVar122;
        auVar82._8_4_ = auVar58._8_4_ * fVar124;
        auVar82._12_4_ = auVar58._12_4_ * fVar126;
        auVar58 = vfmsub213ps_fma(auVar58,local_1630,auVar75);
        auVar66 = vandps_avx(auVar50,auVar44);
        auVar33 = vandps_avx(auVar75,auVar44);
        auVar66 = vcmpps_avx(auVar66,auVar33,1);
        local_14d0 = vblendvps_avx(auVar58,auVar48,auVar66);
        auVar76._0_4_ = fVar130 * auVar46._0_4_;
        auVar76._4_4_ = fVar132 * auVar46._4_4_;
        auVar76._8_4_ = fVar133 * auVar46._8_4_;
        auVar76._12_4_ = fVar134 * auVar46._12_4_;
        auVar48 = vfmsub213ps_fma(auVar46,local_1640,auVar82);
        auVar51._0_4_ = local_1670._0_4_ * fVar88;
        auVar51._4_4_ = local_1670._4_4_ * fVar94;
        auVar51._8_4_ = local_1670._8_4_ * fVar86;
        auVar51._12_4_ = local_1670._12_4_ * fVar87;
        auVar58 = vfmsub213ps_fma(local_1680,local_1650,auVar51);
        auVar66 = vandps_avx(auVar51,auVar44);
        auVar33 = vandps_avx(auVar82,auVar44);
        auVar66 = vcmpps_avx(auVar66,auVar33,1);
        local_14c0 = vblendvps_avx(auVar48,auVar58,auVar66);
        auVar48 = vfmsub213ps_fma(local_1670,local_1630,auVar69);
        auVar57 = vfmsub213ps_fma(auVar57,local_1650,auVar76);
        auVar66 = vandps_avx(auVar69,auVar44);
        auVar33 = vandps_avx(auVar76,auVar44);
        auVar66 = vcmpps_avx(auVar66,auVar33,1);
        local_14b0 = vblendvps_avx(auVar57,auVar48,auVar66);
        auVar57._0_4_ = local_14b0._0_4_ * local_16e0._4_4_;
        auVar57._4_4_ = local_14b0._4_4_ * local_16e0._4_4_;
        auVar57._8_4_ = local_14b0._8_4_ * local_16e0._4_4_;
        auVar57._12_4_ = local_14b0._12_4_ * local_16e0._4_4_;
        auVar66 = vfmadd213ps_fma(auVar135,local_14c0,auVar57);
        auVar66 = vfmadd213ps_fma(local_16d0,local_14d0,auVar66);
        auVar70._0_4_ = auVar66._0_4_ + auVar66._0_4_;
        auVar70._4_4_ = auVar66._4_4_ + auVar66._4_4_;
        auVar70._8_4_ = auVar66._8_4_ + auVar66._8_4_;
        auVar70._12_4_ = auVar66._12_4_ + auVar66._12_4_;
        auVar58._0_4_ = local_14b0._0_4_ * fVar101;
        auVar58._4_4_ = local_14b0._4_4_ * fVar109;
        auVar58._8_4_ = local_14b0._8_4_ * fVar117;
        auVar58._12_4_ = local_14b0._12_4_ * fVar84;
        auVar66 = vfmadd213ps_fma(local_16c0,local_14c0,auVar58);
        auVar33 = vfmadd213ps_fma(auVar41,local_14d0,auVar66);
        auVar66 = vrcpps_avx(auVar70);
        auVar90._8_4_ = 0x3f800000;
        auVar90._0_8_ = 0x3f8000003f800000;
        auVar90._12_4_ = 0x3f800000;
        auVar41 = vfnmadd213ps_fma(auVar66,auVar70,auVar90);
        auVar66 = vfmadd132ps_fma(auVar41,auVar66,auVar66);
        local_14e0._0_4_ = (auVar33._0_4_ + auVar33._0_4_) * auVar66._0_4_;
        local_14e0._4_4_ = (auVar33._4_4_ + auVar33._4_4_) * auVar66._4_4_;
        local_14e0._8_4_ = (auVar33._8_4_ + auVar33._8_4_) * auVar66._8_4_;
        local_14e0._12_4_ = (auVar33._12_4_ + auVar33._12_4_) * auVar66._12_4_;
        uVar2 = *(undefined4 *)(local_1698 + local_16a0 * 4 + 0x60);
        auVar77._4_4_ = uVar2;
        auVar77._0_4_ = uVar2;
        auVar77._8_4_ = uVar2;
        auVar77._12_4_ = uVar2;
        auVar66 = vcmpps_avx(auVar77,local_14e0,2);
        uVar2 = *(undefined4 *)(local_1698 + local_16a0 * 4 + 0x100);
        auVar91._4_4_ = uVar2;
        auVar91._0_4_ = uVar2;
        auVar91._8_4_ = uVar2;
        auVar91._12_4_ = uVar2;
        auVar71 = ZEXT1664(auVar91);
        auVar33 = vcmpps_avx(local_14e0,auVar91,2);
        auVar66 = vandps_avx(auVar66,auVar33);
        auVar33 = local_1690 & auVar66;
        if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar33[0xf] < '\0') {
          auVar66 = vandps_avx(auVar66,local_1690);
          auVar33 = vcmpps_avx(auVar70,_DAT_01f45a50,4);
          local_1510 = vandps_avx(auVar66,auVar33);
          uVar16 = vmovmskps_avx(local_1510);
          if (uVar16 != 0) {
            local_1520 = &local_16f1;
            auVar66 = vrcpps_avx(local_1530);
            auVar52._8_4_ = 0x3f800000;
            auVar52._0_8_ = 0x3f8000003f800000;
            auVar52._12_4_ = 0x3f800000;
            auVar33 = vfnmadd213ps_fma(local_1530,auVar66,auVar52);
            auVar33 = vfmadd132ps_fma(auVar33,auVar66,auVar66);
            auVar45._8_4_ = 0x219392ef;
            auVar45._0_8_ = 0x219392ef219392ef;
            auVar45._12_4_ = 0x219392ef;
            auVar66 = vcmpps_avx(local_1590,auVar45,5);
            auVar66 = vandps_avx(auVar33,auVar66);
            auVar37._0_4_ = local_1550 * auVar66._0_4_;
            auVar37._4_4_ = fStack_154c * auVar66._4_4_;
            auVar37._8_4_ = fStack_1548 * auVar66._8_4_;
            auVar37._12_4_ = fStack_1544 * auVar66._12_4_;
            local_1500 = vminps_avx(auVar37,auVar52);
            auVar38._0_4_ = auVar66._0_4_ * local_1540._0_4_;
            auVar38._4_4_ = auVar66._4_4_ * local_1540._4_4_;
            auVar38._8_4_ = auVar66._8_4_ * local_1540._8_4_;
            auVar38._12_4_ = auVar66._12_4_ * local_1540._12_4_;
            local_14f0 = vminps_avx(auVar38,auVar52);
            uVar24 = (ulong)(uVar16 & 0xff);
            do {
              uVar15 = 0;
              for (uVar17 = uVar24; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
                uVar15 = uVar15 + 1;
              }
              uVar16 = *(uint *)((long)&local_1560 + uVar15 * 4);
              pGVar4 = (local_1600->geometries).items[uVar16].ptr;
              local_16e0 = (long)pGVar4;
              if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_16d0._0_8_ = uVar15;
                  uVar15 = (ulong)(uint)((int)uVar15 * 4);
                  local_12c0 = *(undefined4 *)(local_1500 + uVar15);
                  local_12a0 = *(undefined4 *)(local_14f0 + uVar15);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_14e0 + uVar15);
                  local_15f0.context = context->user;
                  uVar2 = *(undefined4 *)((long)&local_1570 + uVar15);
                  local_1280._4_4_ = uVar2;
                  local_1280._0_4_ = uVar2;
                  local_1280._8_4_ = uVar2;
                  local_1280._12_4_ = uVar2;
                  local_1280._16_4_ = uVar2;
                  local_1280._20_4_ = uVar2;
                  local_1280._24_4_ = uVar2;
                  local_1280._28_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_14d0 + uVar15);
                  uVar3 = *(undefined4 *)(local_14c0 + uVar15);
                  local_1300._4_4_ = uVar3;
                  local_1300._0_4_ = uVar3;
                  local_1300._8_4_ = uVar3;
                  local_1300._12_4_ = uVar3;
                  local_1300._16_4_ = uVar3;
                  local_1300._20_4_ = uVar3;
                  local_1300._24_4_ = uVar3;
                  local_1300._28_4_ = uVar3;
                  uVar3 = *(undefined4 *)(local_14b0 + uVar15);
                  local_12e0._4_4_ = uVar3;
                  local_12e0._0_4_ = uVar3;
                  local_12e0._8_4_ = uVar3;
                  local_12e0._12_4_ = uVar3;
                  local_12e0._16_4_ = uVar3;
                  local_12e0._20_4_ = uVar3;
                  local_12e0._24_4_ = uVar3;
                  local_12e0._28_4_ = uVar3;
                  local_1260._4_4_ = uVar16;
                  local_1260._0_4_ = uVar16;
                  local_1260._8_4_ = uVar16;
                  local_1260._12_4_ = uVar16;
                  local_1260._16_4_ = uVar16;
                  local_1260._20_4_ = uVar16;
                  local_1260._24_4_ = uVar16;
                  local_1260._28_4_ = uVar16;
                  local_1320[0] = (RTCHitN)(char)uVar2;
                  local_1320[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_1320[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_1320[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_1320[4] = (RTCHitN)(char)uVar2;
                  local_1320[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_1320[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_1320[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_1320[8] = (RTCHitN)(char)uVar2;
                  local_1320[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_1320[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_1320[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_1320[0xc] = (RTCHitN)(char)uVar2;
                  local_1320[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_1320[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_1320[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_1320[0x10] = (RTCHitN)(char)uVar2;
                  local_1320[0x11] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_1320[0x12] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_1320[0x13] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_1320[0x14] = (RTCHitN)(char)uVar2;
                  local_1320[0x15] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_1320[0x16] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_1320[0x17] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_1320[0x18] = (RTCHitN)(char)uVar2;
                  local_1320[0x19] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_1320[0x1a] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_1320[0x1b] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_1320[0x1c] = (RTCHitN)(char)uVar2;
                  local_1320[0x1d] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_1320[0x1e] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_1320[0x1f] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  uStack_12bc = local_12c0;
                  uStack_12b8 = local_12c0;
                  uStack_12b4 = local_12c0;
                  uStack_12b0 = local_12c0;
                  uStack_12ac = local_12c0;
                  uStack_12a8 = local_12c0;
                  uStack_12a4 = local_12c0;
                  uStack_129c = local_12a0;
                  uStack_1298 = local_12a0;
                  uStack_1294 = local_12a0;
                  uStack_1290 = local_12a0;
                  uStack_128c = local_12a0;
                  uStack_1288 = local_12a0;
                  uStack_1284 = local_12a0;
                  auVar39 = vpcmpeqd_avx2(local_1260,local_1260);
                  uStack_123c = (local_15f0.context)->instID[0];
                  local_1240 = uStack_123c;
                  uStack_1238 = uStack_123c;
                  uStack_1234 = uStack_123c;
                  uStack_1230 = uStack_123c;
                  uStack_122c = uStack_123c;
                  uStack_1228 = uStack_123c;
                  uStack_1224 = uStack_123c;
                  uStack_121c = (local_15f0.context)->instPrimID[0];
                  local_1220 = uStack_121c;
                  uStack_1218 = uStack_121c;
                  uStack_1214 = uStack_121c;
                  uStack_1210 = uStack_121c;
                  uStack_120c = uStack_121c;
                  uStack_1208 = uStack_121c;
                  uStack_1204 = uStack_121c;
                  local_15c0 = local_14a0;
                  local_15f0.valid = (int *)local_15c0;
                  local_15f0.geometryUserPtr = pGVar4->userPtr;
                  local_15f0.hit = local_1320;
                  local_15f0.N = 8;
                  local_15f0.ray = (RTCRayN *)ray;
                  if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    local_16b0 = auVar71._0_16_;
                    local_16c0._0_8_ = uVar24;
                    auVar39 = ZEXT1632(auVar39._0_16_);
                    (*pGVar4->occlusionFilterN)(&local_15f0);
                    auVar71 = ZEXT1664(local_16b0);
                    auVar39 = vpcmpeqd_avx2(auVar39,auVar39);
                    k = local_16a0;
                    ray = local_1698;
                    uVar24 = local_16c0._0_8_;
                  }
                  auVar6 = vpcmpeqd_avx2(local_15c0,_DAT_01f7b000);
                  auVar8 = auVar39 & ~auVar6;
                  if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar8 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar8 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar8 >> 0x7f,0) == '\0') &&
                        (auVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar8 >> 0xbf,0) == '\0') &&
                      (auVar8 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar8[0x1f]) {
                    auVar6 = auVar6 ^ auVar39;
                  }
                  else {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(local_16e0 + 0x3e) & 0x40) != 0)))) {
                      local_16b0 = auVar71._0_16_;
                      local_16c0._0_8_ = uVar24;
                      auVar39 = ZEXT1632(auVar39._0_16_);
                      (*p_Var5)(&local_15f0);
                      auVar71 = ZEXT1664(local_16b0);
                      auVar39 = vpcmpeqd_avx2(auVar39,auVar39);
                      k = local_16a0;
                      ray = local_1698;
                      uVar24 = local_16c0._0_8_;
                    }
                    auVar8 = vpcmpeqd_avx2(local_15c0,_DAT_01f7b000);
                    auVar6 = auVar8 ^ auVar39;
                    auVar53._8_4_ = 0xff800000;
                    auVar53._0_8_ = 0xff800000ff800000;
                    auVar53._12_4_ = 0xff800000;
                    auVar53._16_4_ = 0xff800000;
                    auVar53._20_4_ = 0xff800000;
                    auVar53._24_4_ = 0xff800000;
                    auVar53._28_4_ = 0xff800000;
                    auVar39 = vblendvps_avx(auVar53,*(undefined1 (*) [32])(local_15f0.ray + 0x100),
                                            auVar8);
                    *(undefined1 (*) [32])(local_15f0.ray + 0x100) = auVar39;
                  }
                  if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar6 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar6 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar6 >> 0x7f,0) == '\0') &&
                        (auVar6 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar6 >> 0xbf,0) == '\0') &&
                      (auVar6 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar6[0x1f]) {
                    *(int *)(ray + k * 4 + 0x100) = auVar71._0_4_;
                    uVar24 = uVar24 ^ 1L << (local_16d0._0_8_ & 0x3f);
                    goto LAB_016d1e6e;
                  }
                }
                *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                goto LAB_016d1fd7;
              }
              uVar24 = uVar24 ^ 1L << (uVar15 & 0x3f);
LAB_016d1e6e:
            } while (uVar24 != 0);
          }
        }
      }
      auVar71 = ZEXT3264(local_1340);
      auVar78 = ZEXT3264(local_1360);
      auVar83 = ZEXT3264(local_1380);
      auVar131 = ZEXT3264(local_1460);
      auVar136 = ZEXT3264(local_1480);
      uVar24 = local_1618;
      fVar84 = local_13a0;
      fVar86 = fStack_139c;
      fVar87 = fStack_1398;
      fVar118 = fStack_1394;
      fVar122 = fStack_1390;
      fVar124 = fStack_138c;
      fVar126 = fStack_1388;
      fVar88 = local_13c0;
      fVar130 = fStack_13bc;
      fVar132 = fStack_13b8;
      fVar133 = fStack_13b4;
      fVar134 = fStack_13b0;
      fVar92 = fStack_13ac;
      fVar93 = fStack_13a8;
      fVar94 = local_13e0;
      fVar95 = fStack_13dc;
      fVar96 = fStack_13d8;
      fVar97 = fStack_13d4;
      fVar98 = fStack_13d0;
      fVar99 = fStack_13cc;
      fVar100 = fStack_13c8;
      fVar101 = local_1400;
      fVar103 = fStack_13fc;
      fVar104 = fStack_13f8;
      fVar105 = fStack_13f4;
      fVar106 = fStack_13f0;
      fVar107 = fStack_13ec;
      fVar108 = fStack_13e8;
      fVar109 = local_1420;
      fVar111 = fStack_141c;
      fVar112 = fStack_1418;
      fVar113 = fStack_1414;
      fVar114 = fStack_1410;
      fVar115 = fStack_140c;
      fVar116 = fStack_1408;
      fVar117 = local_1440;
      fVar121 = fStack_143c;
      fVar123 = fStack_1438;
      fVar125 = fStack_1434;
      fVar127 = fStack_1430;
      fVar128 = fStack_142c;
      fVar129 = fStack_1428;
    }
LAB_016d1fac:
    local_16e8 = local_16f0;
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }